

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.hpp
# Opt level: O1

string * __thiscall
CLI::Formatter::make_option_usage_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,Option *opt)

{
  bool bVar1;
  ostream *this_00;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  long lVar5;
  char *pcVar6;
  stringstream out;
  long *local_1f0;
  long local_1e8;
  long local_1e0;
  long lStack_1d8;
  long *local_1d0 [2];
  long local_1c0 [2];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  (*(this->super_FormatterBase)._vptr_FormatterBase[0xc])(&local_1f0,this,opt,1);
  this_00 = local_1a0;
  ::std::__ostream_insert<char,std::char_traits<char>>(this_00,(char *)local_1f0,local_1e8);
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,local_1e0 + 1);
  }
  if (opt->expected_max_ < 0x20000000) {
    if (opt->expected_max_ < 2) goto LAB_0011c6d4;
    ::std::__ostream_insert<char,std::char_traits<char>>(this_00,"(",1);
    this_00 = (ostream *)::std::ostream::operator<<((ostream *)this_00,opt->expected_min_);
    lVar5 = 2;
    pcVar6 = "x)";
  }
  else {
    lVar5 = 3;
    pcVar6 = "...";
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(this_00,pcVar6,lVar5);
LAB_0011c6d4:
  bVar1 = (opt->super_OptionBase<CLI::Option>).required_;
  if (bVar1 == true) {
    ::std::__cxx11::stringbuf::str();
  }
  else {
    ::std::__cxx11::stringbuf::str();
    plVar2 = (long *)::std::__cxx11::string::replace((ulong)local_1d0,0,(char *)0x0,0x170de9);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_1e0 = *plVar3;
      lStack_1d8 = plVar2[3];
      local_1f0 = &local_1e0;
    }
    else {
      local_1e0 = *plVar3;
      local_1f0 = (long *)*plVar2;
    }
    local_1e8 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)::std::__cxx11::string::append((char *)&local_1f0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar4 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar4) {
      lVar5 = plVar2[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    }
    __return_storage_ptr__->_M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
  }
  if (bVar1 == false) {
    if (local_1f0 != &local_1e0) {
      operator_delete(local_1f0,local_1e0 + 1);
    }
    if (local_1d0[0] != local_1c0) {
      operator_delete(local_1d0[0],local_1c0[0] + 1);
    }
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  ::std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_option_usage(const Option *opt) const {
    // Note that these are positionals usages
    std::stringstream out;
    out << make_option_name(opt, true);
    if(opt->get_expected_max() >= detail::expected_max_vector_size)
        out << "...";
    else if(opt->get_expected_max() > 1)
        out << "(" << opt->get_expected() << "x)";

    return opt->get_required() ? out.str() : "[" + out.str() + "]";
}